

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O3

string * to_lower_case(string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  size_type sVar3;
  byte *pbVar4;
  string *in_RDI;
  byte *pbVar5;
  
  pbVar4 = (byte *)(str->_M_dataplus)._M_p;
  sVar3 = str->_M_string_length;
  pbVar5 = pbVar4;
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else {
    do {
      if ((byte)(*pbVar5 + 0xbf) < 0x1a) {
        *pbVar5 = *pbVar5 | 0x20;
        pbVar4 = (byte *)(str->_M_dataplus)._M_p;
        sVar3 = str->_M_string_length;
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar4 + sVar3);
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pbVar4 == paVar1) {
    uVar2 = *(undefined8 *)((long)&str->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar2;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)pbVar4;
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = sVar3;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

std::string to_lower_case(std::string str) {
  for(std::string::iterator letter = str.begin(); letter != str.end(); letter++) {
    if(is_upper_case(*letter)) {
      *letter = to_lower_case(*letter);
    }
  }
  return str;
}